

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderDerivateTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::LinearDerivateCase::~LinearDerivateCase(LinearDerivateCase *this)

{
  ~LinearDerivateCase(this);
  operator_delete(this,0x118);
  return;
}

Assistant:

~LinearDerivateCase		(void) {}